

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

bool S2LatLngRect::IntersectsLngEdge(S2Point *a,S2Point *b,R1Interval *lat,double lng)

{
  int iVar1;
  double dVar2;
  R2Point local_78;
  S2Point local_68;
  R2Point local_50;
  S2Point local_40;
  double local_28;
  double lng_local;
  R1Interval *lat_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_28 = lng;
  lng_local = (double)lat;
  lat_local = (R1Interval *)b;
  b_local = a;
  dVar2 = R1Interval::lo(lat);
  local_50.c_ = (VType  [2])S2LatLng::FromRadians(dVar2,local_28);
  S2LatLng::ToPoint(&local_40,(S2LatLng *)&local_50);
  dVar2 = R1Interval::hi((R1Interval *)lng_local);
  local_78.c_ = (VType  [2])S2LatLng::FromRadians(dVar2,local_28);
  S2LatLng::ToPoint(&local_68,(S2LatLng *)&local_78);
  iVar1 = S2::CrossingSign(a,b,&local_40,&local_68);
  return 0 < iVar1;
}

Assistant:

bool S2LatLngRect::IntersectsLngEdge(const S2Point& a, const S2Point& b,
                                     const R1Interval& lat, double lng) {
  // Return true if the segment AB intersects the given edge of constant
  // longitude.  The nice thing about edges of constant longitude is that
  // they are straight lines on the sphere (geodesics).

  return S2::CrossingSign(
      a, b, S2LatLng::FromRadians(lat.lo(), lng).ToPoint(),
      S2LatLng::FromRadians(lat.hi(), lng).ToPoint()) > 0;
}